

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_typed_array_create(JSContext *ctx,JSValue ctor,int argc,JSValue *argv)

{
  uint uVar1;
  int iVar2;
  JSValueUnion JVar3;
  ulong uVar4;
  JSValue obj;
  JSValue JVar5;
  int64_t len;
  
  obj = JS_CallConstructorInternal(ctx,ctor,ctor,argc,argv,2);
  JVar3 = obj.u;
  if ((uint)obj.tag == 6) {
LAB_00167eb0:
    uVar4 = (ulong)JVar3.ptr & 0xffffffff00000000;
  }
  else {
    uVar1 = js_typed_array_get_length_internal(ctx,obj);
    if (-1 < (int)uVar1) {
      if (argc != 1) goto LAB_00167eb0;
      JVar5 = *argv;
      if (0xfffffff4 < (uint)argv->tag) {
        *(int *)(argv->u).ptr = *(argv->u).ptr + 1;
      }
      iVar2 = JS_ToLengthFree(ctx,&len,JVar5);
      if (iVar2 == 0) {
        if (len <= (long)(ulong)uVar1) goto LAB_00167eb0;
        JS_ThrowTypeError(ctx,"TypedArray length is too small");
      }
    }
    if ((0xfffffff4 < (uint)obj.tag) &&
       (iVar2 = *JVar3.ptr, *(int *)JVar3.ptr = iVar2 + -1, iVar2 < 2)) {
      __JS_FreeValueRT(ctx->rt,obj);
    }
    obj = (JSValue)(ZEXT816(6) << 0x40);
    uVar4 = 0;
  }
  JVar5.u.ptr = (void *)((ulong)obj.u.ptr & 0xffffffff | uVar4);
  JVar5.tag = obj.tag;
  return JVar5;
}

Assistant:

static JSValue js_typed_array_create(JSContext *ctx, JSValueConst ctor,
                                     int argc, JSValueConst *argv)
{
    JSValue ret;
    int new_len;
    int64_t len;

    ret = JS_CallConstructor(ctx, ctor, argc, argv);
    if (JS_IsException(ret))
        return ret;
    /* validate the typed array */
    new_len = js_typed_array_get_length_internal(ctx, ret);
    if (new_len < 0)
        goto fail;
    if (argc == 1) {
        /* ensure that it is large enough */
        if (JS_ToLengthFree(ctx, &len, JS_DupValue(ctx, argv[0])))
            goto fail;
        if (new_len < len) {
            JS_ThrowTypeError(ctx, "TypedArray length is too small");
        fail:
            JS_FreeValue(ctx, ret);
            return JS_EXCEPTION;
        }
    }
    return ret;
}